

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

DecodedResult * bech32::decode(DecodedResult *__return_storage_ptr__,string *bstring)

{
  pointer __dest;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  runtime_error *this;
  size_type sVar6;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dp;
  string hrp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  string local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  anon_unknown.dwarf_41b1d::rejectBStringTooShort(bstring);
  anon_unknown.dwarf_41b1d::rejectBStringTooLong(bstring);
  anon_unknown.dwarf_41b1d::rejectBStringMixedCase(bstring);
  anon_unknown.dwarf_41b1d::rejectBStringValuesOutOfRange(bstring);
  anon_unknown.dwarf_41b1d::rejectBStringWithNoSeparator(bstring);
  std::__cxx11::string::rfind((char)bstring,0x31);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)bstring);
  anon_unknown.dwarf_41b1d::extractDataPart(&local_90,bstring);
  anon_unknown.dwarf_41b1d::rejectHRPTooShort(&local_78);
  anon_unknown.dwarf_41b1d::rejectHRPTooLong(&local_78);
  sVar2 = local_78._M_string_length;
  _Var1._M_p = local_78._M_dataplus._M_p;
  if ((ulong)((long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 6) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"data part must be at least six characters");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_78._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar4 = tolower((int)_Var1._M_p[sVar6]);
      _Var1._M_p[sVar6] = (char)iVar4;
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  anon_unknown.dwarf_41b1d::mapDP(&local_90);
  bVar3 = anon_unknown.dwarf_41b1d::verifyChecksum(&local_78,&local_90);
  if (bVar3) {
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -6;
    __return_storage_ptr__->encoding = Bech32m;
    (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hrp).field_2
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->hrp,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              (&(__return_storage_ptr__->dp).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    anon_unknown.dwarf_41b1d::expandHrp(&local_58,&local_78);
    anon_unknown.dwarf_41b1d::cat(&local_40,&local_58,&local_90);
    uVar5 = anon_unknown.dwarf_41b1d::polymod(&local_40);
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar5 != 1) {
      *(undefined8 *)__return_storage_ptr__ = 0;
      (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->hrp)._M_string_length = 0;
      (__return_storage_ptr__->hrp).field_2._M_allocated_capacity = 0;
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->hrp).field_2 + 8) = 0;
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->hrp)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->hrp).field_2;
      (__return_storage_ptr__->hrp)._M_string_length = 0;
      (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00118712;
    }
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -6;
    __return_storage_ptr__->encoding = Bech32;
    (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hrp).field_2
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->hrp,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
              (&(__return_storage_ptr__->dp).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  __dest = (__return_storage_ptr__->dp).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  (__return_storage_ptr__->dp).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
LAB_00118712:
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DecodedResult decode(const std::string & bstring) {
        rejectBStringThatIsntWellFormed(bstring);
        std::string hrp = extractHumanReadablePart(bstring);
        std::vector<unsigned char> dp = extractDataPart(bstring);
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectDPTooShort(dp);
        convertToLowercase(hrp);
        mapDP(dp);
        if (verifyChecksum(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32m, hrp, dp};
        }
        else if (verifyChecksumUsingOriginalConstant(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32, hrp, dp};
        }
        else {
            return DecodedResult();
        }
    }